

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_active_uniform(NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLuint program_00;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  string local_2e8;
  GLint numActiveUniforms;
  string local_2a8;
  string local_288;
  undefined1 local_268 [384];
  ShaderProgram program;
  
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,&local_2e9);
  getVtxFragVersionSources((string *)&numActiveUniforms,&local_288,ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,&local_2ea);
  getVtxFragVersionSources(&local_2e8,&local_2a8,ctx);
  glu::makeVtxFragSources((ProgramSources *)local_268,(string *)&numActiveUniforms,&local_2e8);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_268);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_268);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&numActiveUniforms);
  std::__cxx11::string::~string((string *)&local_288);
  numActiveUniforms = -1;
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8b86,&numActiveUniforms);
  local_268._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_268 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// GL_ACTIVE_UNIFORMS = ");
  std::ostream::operator<<(this,numActiveUniforms);
  std::operator<<((ostream *)this," (expected 4).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             (allocator<char> *)&local_2e8);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,0xffffffff,0,0,(GLsizei *)0x0,(GLint *)0x0,(GLenum *)0x0,
             (GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_OPERATION is generated if program is not a program object.",
             (allocator<char> *)&local_2e8);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,program_00,0,0,(GLsizei *)0x0,(GLint *)0x0,(GLenum *)0x0,
             (GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_VALUE is generated if index is greater than or equal to the number of active uniform variables in program."
             ,(allocator<char> *)&local_2e8);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,program.m_program.m_program,numActiveUniforms,0,
             (GLsizei *)0x0,(GLint *)0x0,(GLenum *)0x0,(GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,"GL_INVALID_VALUE is generated if bufSize is less than 0.",
             (allocator<char> *)&local_2e8);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0,-1,(GLsizei *)0x0,(GLint *)0x0
             ,(GLenum *)0x0,(GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_active_uniform (NegativeTestContext& ctx)
{
	GLuint				shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram	program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				numActiveUniforms	= -1;

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_UNIFORMS,	&numActiveUniforms);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORMS = " << numActiveUniforms << " (expected 4)." << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveUniform(-1, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveUniform(shader, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to the number of active uniform variables in program.");
	ctx.glUseProgram(program.getProgram());
	ctx.glGetActiveUniform(program.getProgram(), numActiveUniforms, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is less than 0.");
	ctx.glGetActiveUniform(program.getProgram(), 0, -1, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}